

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O1

string * anon_unknown.dwarf_423ae0::make_include_path
                   (string *__return_storage_ptr__,string *base_path,string *dest_path)

{
  long lVar1;
  size_type sVar2;
  long *plVar3;
  size_type *psVar4;
  char *pcVar5;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  sVar2 = std::__cxx11::string::rfind((char)base_path,0x2f);
  if (sVar2 == base_path->_M_string_length) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = (dest_path->_M_dataplus)._M_p;
    sVar2 = dest_path->_M_string_length;
  }
  else {
    sVar2 = dest_path->_M_string_length;
    if ((sVar2 == 0) || (pcVar5 = (dest_path->_M_dataplus)._M_p, *pcVar5 != '/')) {
      std::__cxx11::string::substr((ulong)local_40,(ulong)base_path);
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_40,(ulong)(dest_path->_M_dataplus)._M_p);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar4) {
        lVar1 = plVar3[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      }
      __return_storage_ptr__->_M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (local_40[0] == local_30) {
        return __return_storage_ptr__;
      }
      operator_delete(local_40[0]);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar5,pcVar5 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string make_include_path(const std::string& base_path, const std::string& dest_path)
{
    size_t last_slash_pos = base_path.find_last_of('/');

    if (last_slash_pos == base_path.length())
    {
        return dest_path;
    }

    if (dest_path.length() >= 1 && dest_path[0] == '/')
    {
        return dest_path;
    }

    return base_path.substr(0, last_slash_pos + 1) + dest_path;
}